

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

RandomUniformLikeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::RandomUniformLikeLayerParams>
          (Arena *arena)

{
  RandomUniformLikeLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (RandomUniformLikeLayerParams *)operator_new(0x28);
    CoreML::Specification::RandomUniformLikeLayerParams::RandomUniformLikeLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (RandomUniformLikeLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::RandomUniformLikeLayerParams::typeinfo);
    CoreML::Specification::RandomUniformLikeLayerParams::RandomUniformLikeLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }